

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

bool __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer
          (CaptureVertexInterleaved *this,BindBufferCase bind_case,GLenum primitive_type)

{
  uint uVar1;
  RenderContext *pRVar2;
  ulong uVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  undefined4 *puVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  undefined4 in_register_00000034;
  ulong uVar13;
  GLint i;
  ulong uVar14;
  long lVar6;
  
  pRVar2 = this->m_context->m_renderCtx;
  iVar4 = (*pRVar2->_vptr_RenderContext[3])(pRVar2,CONCAT44(in_register_00000034,bind_case));
  lVar6 = CONCAT44(extraout_var,iVar4);
  if (6 < primitive_type) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 0;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  uVar3 = *(ulong *)(&DAT_0164b788 + (ulong)primitive_type * 8);
  lVar7 = (**(code **)(lVar6 + 0xcf8))(0x8c8e,35000);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xa89);
  uVar1 = this->m_max_transform_feedback_components;
  uVar10 = 0;
  uVar9 = (ulong)(uVar1 - 4);
  if ((int)(uVar1 - 4) < 1) {
    uVar9 = uVar10;
  }
  uVar13 = 0;
  bVar11 = true;
  do {
    if ((uVar3 <= uVar13) || (bVar11 == false)) goto LAB_00930d85;
    uVar14 = 0;
    do {
      bVar12 = bVar11;
      if (uVar9 == uVar14) goto LAB_00930cff;
      iVar4 = (int)uVar14;
      uVar14 = uVar14 + 1;
    } while (ABS(*(float *)(lVar7 + (ulong)(uint)((int)uVar10 + iVar4) * 4) - (float)iVar4) <= 0.125
            );
    bVar12 = false;
LAB_00930cff:
    uVar13 = uVar13 + 1;
    iVar4 = uVar1 * (int)uVar13;
    if (0.125 < ABS(ABS(*(float *)(lVar7 + (ulong)(iVar4 - 4) * 4)) + -1.0 + 0.0625)) break;
    bVar11 = false;
    if ((0.125 < ABS(ABS(*(float *)(lVar7 + (ulong)(iVar4 - 3) * 4)) + -1.0 + 0.0625)) ||
       (0.125 < ABS(*(float *)(lVar7 + (ulong)(iVar4 - 2) * 4)))) goto LAB_00930d85;
    uVar10 = uVar10 + uVar1;
    bVar11 = bVar12;
  } while (ABS(*(float *)(lVar7 + (ulong)(iVar4 - 1) * 4) + -1.0) <= 0.125);
  bVar11 = false;
LAB_00930d85:
  (**(code **)(lVar6 + 0x1670))(0x8c8e);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xaad);
  return bVar11;
}

Assistant:

bool gl3cts::TransformFeedback::CaptureVertexInterleaved::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					   glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check */
	glw::GLuint number_of_vertices = 0;

	switch (primitive_type)
	{
	case GL_POINTS:
		number_of_vertices = 4;
		break;
	case GL_LINES:
		number_of_vertices = 4;
		break;
	case GL_LINE_LOOP:
		number_of_vertices = 8;
		break;
	case GL_LINE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLES:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_STRIP:
		number_of_vertices = 6;
		break;
	case GL_TRIANGLE_FAN:
		number_of_vertices = 6;
		break;
	default:
		throw 0;
	}

	glw::GLfloat* results = (glw::GLfloat*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	bool is_ok = true;

	for (glw::GLuint j = 0; (j < number_of_vertices) && is_ok; ++j)
	{
		for (glw::GLint i = 0; i < m_max_transform_feedback_components - 4; ++i)
		{
			glw::GLfloat result	= results[i + j * m_max_transform_feedback_components];
			glw::GLfloat reference = (glw::GLfloat)(i);

			if (fabs(result - reference) > 0.125 /* precision */)
			{
				is_ok = false;

				break;
			}
		}

		/* gl_Position */
		glw::GLfloat result[4] = { results[(j + 1) * m_max_transform_feedback_components - 4],
								   results[(j + 1) * m_max_transform_feedback_components - 3],
								   results[(j + 1) * m_max_transform_feedback_components - 2],
								   results[(j + 1) * m_max_transform_feedback_components - 1] };

		if ((fabs(fabs(result[0]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(fabs(result[1]) - 1.0 + s_rasterization_epsilon) > 0.125 /* precision */) ||
			(fabs(result[2]) > 0.125 /* precision */) || (fabs(result[3] - 1.0) > 0.125 /* precision */))
		{
			is_ok = false;

			break;
		}
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}